

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

QString * __thiscall
QAccessibleTextWidget::text
          (QString *__return_storage_ptr__,QAccessibleTextWidget *this,int startOffset,int endOffset
          )

{
  long lVar1;
  QArrayDataPointer<char16_t> *other;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  QTextCursor cursor;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _cursor = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x158))(&cursor);
  iVar2 = (int)&cursor;
  QTextCursor::setPosition(iVar2,startOffset);
  QTextCursor::setPosition(iVar2,endOffset);
  QTextCursor::selectedText();
  other = (QArrayDataPointer<char16_t> *)
          QString::replace((QChar)(char16_t)&local_50,(QChar)0x2029,10);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,other);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QTextCursor::~QTextCursor(&cursor);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTextWidget::text(int startOffset, int endOffset) const
{
    QTextCursor cursor(textCursor());

    cursor.setPosition(startOffset, QTextCursor::MoveAnchor);
    cursor.setPosition(endOffset, QTextCursor::KeepAnchor);

    return cursor.selectedText().replace(QChar(QChar::ParagraphSeparator), u'\n');
}